

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CheckTerrain
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *this;
  sector_t *sect;
  char *__assertion;
  bool bVar5;
  double dVar6;
  double dVar7;
  FName local_24;
  DAngle local_20;
  DAngle local_18;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003e49b3;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        pPVar4 = (this->super_DThinker).super_DObject.Class;
        if (pPVar4 == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
          (this->super_DThinker).super_DObject.Class = pPVar4;
        }
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar1 && bVar5) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar5 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar1) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e49b3;
        }
        sect = this->Sector;
        dVar6 = (sect->floorplane).normal.X * (this->__Pos).X + (sect->floorplane).D;
        goto LAB_003e48a6;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_003e499a;
    dVar6 = (_DAT_00000130->floorplane).normal.X * _DAT_00000048 + (_DAT_00000130->floorplane).D;
    this = (AActor *)0x0;
    sect = _DAT_00000130;
LAB_003e48a6:
    dVar7 = ((sect->floorplane).normal.Y * (this->__Pos).Y + dVar6) * (sect->floorplane).negiC;
    dVar6 = (this->__Pos).Z;
    if (((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) &&
       ((sect->planes[0].Flags & 0x1d0U) != 0x100)) {
      if (sect->special == 0x76) {
        iVar3 = FTagManager::GetFirstSectorTag(&tagManager,sect);
        iVar2 = (iVar3 + -100) / 10;
        local_20.Degrees = (double)iVar2 * 45.0;
        AActor::Thrust(this,&local_20,(double)(iVar3 + iVar2 * -10 + -100) * 0.0625);
      }
      else if (sect->special == 0x73) {
        local_24.Index = 0xcb;
        local_18.Degrees = 0.0;
        P_DamageMobj(this,(AActor *)0x0,(AActor *)0x0,999,&local_24,0,&local_18);
      }
    }
    return 0;
  }
LAB_003e499a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003e49b3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1ab0,
                "int AF_AActor_A_CheckTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckTerrain)
{
	PARAM_SELF_PROLOGUE(AActor);

	sector_t *sec = self->Sector;

	if (self->Z() == sec->floorplane.ZatPoint(self) && sec->PortalBlocksMovement(sector_t::floor))
	{
		if (sec->special == Damage_InstantDeath)
		{
			P_DamageMobj(self, NULL, NULL, 999, NAME_InstantDeath);
		}
		else if (sec->special == Scroll_StrifeCurrent)
		{
			int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
			double speed = (anglespeed % 10) / 16.;
			DAngle an = (anglespeed / 10) * (360 / 8.);
			self->Thrust(an, speed);
		}
	}
	return 0;
}